

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

Abc_Obj_t * Abc_NodeFindNonCoFanout(Abc_Obj_t *pNode)

{
  Abc_Obj_t *pAVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if ((pNode->vFanouts).nSize <= lVar2) {
      return (Abc_Obj_t *)0x0;
    }
    pAVar1 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar2]];
    lVar2 = lVar2 + 1;
  } while (0xfffffffd < (*(uint *)&pAVar1->field_0x14 & 0xf) - 5);
  return pAVar1;
}

Assistant:

Abc_Obj_t * Abc_NodeFindNonCoFanout( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanout;
    int i;
    Abc_ObjForEachFanout( pNode, pFanout, i )
        if ( !Abc_ObjIsCo(pFanout) )
            return pFanout;
    return NULL;
}